

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O0

int Abc_SclCheckNtk(Abc_Ntk_t *p,int fVerbose)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *p_00;
  int local_34;
  int local_30;
  int fFlag;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  int fVerbose_local;
  Abc_Ntk_t *p_local;
  
  local_34 = 1;
  Abc_NtkIncrementTravId(p);
  for (fFlag = 0; iVar1 = Abc_NtkCiNum(p), fFlag < iVar1; fFlag = fFlag + 1) {
    pAVar4 = Abc_NtkCi(p,fFlag);
    Abc_NodeSetTravIdCurrent(pAVar4);
  }
  for (fFlag = 0; iVar1 = Vec_PtrSize(p->vObjs), fFlag < iVar1; fFlag = fFlag + 1) {
    pAVar4 = Abc_NtkObj(p,fFlag);
    if ((pAVar4 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar4), iVar1 != 0)) {
      for (local_30 = 0; iVar1 = Abc_ObjFaninNum(pAVar4), local_30 < iVar1; local_30 = local_30 + 1)
      {
        p_00 = Abc_ObjFanin(pAVar4,local_30);
        iVar1 = Abc_NodeIsTravIdCurrent(p_00);
        if (iVar1 == 0) {
          uVar3 = Abc_ObjId(pAVar4);
          uVar2 = Abc_ObjId(p_00);
          printf("obj %d and its fanin %d are not in the topo order\n",(ulong)uVar3,(ulong)uVar2);
          local_34 = 0;
        }
      }
      Abc_NodeSetTravIdCurrent(pAVar4);
      iVar1 = Abc_ObjIsBarBuf(pAVar4);
      if (iVar1 == 0) {
        iVar1 = Abc_ObjFanoutNum(pAVar4);
        if (iVar1 == 0) {
          uVar3 = Abc_ObjId(pAVar4);
          printf("node %d has no fanout\n",(ulong)uVar3);
          local_34 = 0;
        }
        if (local_34 == 0) break;
      }
    }
  }
  if ((local_34 != 0) && (fVerbose != 0)) {
    printf("The network is in topo order and no dangling nodes.\n");
  }
  return local_34;
}

Assistant:

int Abc_SclCheckNtk( Abc_Ntk_t * p, int fVerbose )
{
    Abc_Obj_t * pObj, * pFanin;
    int i, k, fFlag = 1;
    Abc_NtkIncrementTravId( p );        
    Abc_NtkForEachCi( p, pObj, i )
        Abc_NodeSetTravIdCurrent( pObj );
    Abc_NtkForEachNode( p, pObj, i )
    {
        Abc_ObjForEachFanin( pObj, pFanin, k )
            if ( !Abc_NodeIsTravIdCurrent( pFanin ) )
                printf( "obj %d and its fanin %d are not in the topo order\n", Abc_ObjId(pObj), Abc_ObjId(pFanin) ), fFlag = 0;
        Abc_NodeSetTravIdCurrent( pObj );
        if ( Abc_ObjIsBarBuf(pObj) )
            continue;
        if ( Abc_ObjFanoutNum(pObj) == 0 )
            printf( "node %d has no fanout\n", Abc_ObjId(pObj) ), fFlag = 0;
        if ( !fFlag )
            break;
    }
    if ( fFlag && fVerbose )
        printf( "The network is in topo order and no dangling nodes.\n" );
    return fFlag;
}